

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

uint64_t enet_crc64(ENetBuffer *buffers,int bufferCount)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  if (bufferCount < 1) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    do {
      if (0 < (long)buffers->dataLength) {
        pbVar5 = (byte *)buffers->data;
        pbVar4 = pbVar5 + buffers->dataLength;
        do {
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          uVar3 = uVar3 >> 8 ^ crcTable[(uint)bVar1 ^ (uint)uVar3 & 0xff];
        } while (pbVar5 < pbVar4);
      }
      buffers = buffers + 1;
      bVar2 = 1 < bufferCount;
      bufferCount = bufferCount + -1;
    } while (bVar2);
    uVar3 = ~uVar3;
  }
  return uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
}

Assistant:

uint64_t enet_crc64(const ENetBuffer* buffers, int bufferCount) {
	uint64_t crc = 0xFFFFFFFFFFFFFFFF;

	while (bufferCount-- > 0) {
		const uint8_t* data = (const uint8_t*)buffers->data;
		const uint8_t* dataEnd = &data[buffers->dataLength];

		while (data < dataEnd) {
			crc = (crc >> 8) ^ crcTable[(uint8_t)crc ^ *data++];
		}

		++buffers;
	}

	return ENET_HOST_TO_NET_64(~crc);
}